

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall ctemplate::Template::StripBuffer(Template *this,char **buffer,size_t *len)

{
  ulong uVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t needle_len;
  char *needle;
  size_t len_00;
  char *line;
  char *pcVar7;
  MarkerDelimiters delim;
  MarkerDelimiters local_70;
  char **local_50;
  char *local_48;
  Template *local_40;
  char *local_38;
  
  if (this->strip_ != DO_NOT_STRIP) {
    line = *buffer;
    uVar1 = *len;
    local_40 = this;
    pcVar2 = (char *)operator_new__(uVar1);
    needle = "{{";
    local_70.start_marker = "{{";
    needle_len = 2;
    local_70.start_marker_len = 2;
    local_70.end_marker = "}}";
    local_70.end_marker_len = 2;
    pcVar5 = pcVar2;
    if (0 < (long)uVar1) {
      local_48 = line + uVar1;
      local_50 = buffer;
      do {
        pcVar6 = local_48;
        pvVar3 = memchr(line,10,(long)local_48 - (long)line);
        pcVar7 = (char *)((long)pvVar3 + 1);
        if (pvVar3 == (void *)0x0) {
          pcVar7 = pcVar6;
        }
        len_00 = (long)pcVar7 - (long)line;
        sVar4 = InsertLine(line,len_00,local_40->strip_,&local_70,pcVar5);
        pcVar5 = pcVar5 + sVar4;
        if ((pcVar5 < pcVar2) || (*len < (ulong)((long)pcVar5 - (long)pcVar2))) {
          __assert_fail("write_pos >= retval && static_cast<size_t>(write_pos-retval) <= *len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0x9f4,"void ctemplate::Template::StripBuffer(char **, size_t *)");
        }
        local_38 = pcVar5;
        if (line != (char *)0x0) {
          while (pcVar5 = anon_unknown_14::memmatch(line,len_00,needle,needle_len),
                sVar4 = local_70.end_marker_len, pcVar5 != (char *)0x0) {
            pcVar5 = pcVar5 + needle_len;
            pcVar6 = anon_unknown_14::memmatch
                               (pcVar5,(long)pcVar7 - (long)pcVar5,local_70.end_marker,
                                local_70.end_marker_len);
            if (pcVar6 == (char *)0x0) break;
            if ((long)pcVar6 - (long)pcVar5 < 0) {
              __assert_fail("((end_marker - delim.end_marker_len) - (marker + delim.start_marker_len)) >= 0"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                            ,0xa0a,"void ctemplate::Template::StripBuffer(char **, size_t *)");
            }
            line = pcVar6 + sVar4;
            ParseDelimiters(pcVar5,(long)pcVar6 - (long)pcVar5,&local_70);
            len_00 = (long)pcVar7 - (long)line;
            needle_len = local_70.start_marker_len;
            needle = local_70.start_marker;
          }
        }
        pcVar5 = local_38;
        line = pcVar7;
      } while (pcVar7 < local_48);
      buffer = local_50;
      if (local_38 < pcVar2) {
        __assert_fail("write_pos >= retval",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0xa11,"void ctemplate::Template::StripBuffer(char **, size_t *)");
      }
    }
    if (*buffer != (char *)0x0) {
      operator_delete__(*buffer);
    }
    *buffer = pcVar2;
    *len = (long)pcVar5 - (long)pcVar2;
  }
  return;
}

Assistant:

void Template::StripBuffer(char **buffer, size_t* len) {
  if (strip_ == DO_NOT_STRIP)
    return;

  char* bufend = *buffer + *len;
  char* retval = new char[*len];
  char* write_pos = retval;

  MarkerDelimiters delim;

  const char* next_pos = NULL;
  for (const char* prev_pos = *buffer; prev_pos < bufend; prev_pos = next_pos) {
    next_pos = (char*)memchr(prev_pos, '\n', bufend - prev_pos);
    if (next_pos)
      next_pos++;          // include the newline
    else
      next_pos = bufend;   // for the last line, when it has no newline

    write_pos += InsertLine(prev_pos, next_pos - prev_pos, strip_, delim,
                            write_pos);
    assert(write_pos >= retval &&
           static_cast<size_t>(write_pos-retval) <= *len);

    // Before looking at the next line, see if the current line
    // changed the marker-delimiter.  We care for
    // IsBlankOrOnlyHasOneRemovableMarker, so we don't need to be
    // perfect -- we don't have to handle the delimiter changing in
    // the middle of a line -- just make sure that the next time
    // there's only one marker on a line, we notice because we know
    // the right delim.
    const char* end_marker = NULL;
    for (const char* marker = prev_pos; marker; marker = end_marker) {
      marker = memmatch(marker, next_pos - marker,
                        delim.start_marker, delim.start_marker_len);
      if (!marker)  break;
      end_marker = memmatch(marker + delim.start_marker_len,
                            next_pos - (marker + delim.start_marker_len),
                            delim.end_marker, delim.end_marker_len);
      if (!end_marker)  break;
      end_marker += delim.end_marker_len;  // needed for the for loop
      // This tries to parse the marker as a set-delimiters marker.
      // If it succeeds, it updates delim. If not, it ignores it.
      assert(((end_marker - delim.end_marker_len)
              - (marker + delim.start_marker_len)) >= 0);
      Template::ParseDelimiters(marker + delim.start_marker_len,
                                ((end_marker - delim.end_marker_len)
                                 - (marker + delim.start_marker_len)),
                                &delim);
    }
  }
  assert(write_pos >= retval);

  // Replace the input retval with our new retval.
  delete[] *buffer;
  *buffer = retval;
  *len = static_cast<size_t>(write_pos - retval);
}